

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfad.h
# Opt level: O2

TFad<6,_double> * __thiscall
TFad<6,double>::operator=
          (TFad<6,double> *this,
          TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFad<6,_double>_>_> *fadexpr)

{
  TFad<6,_double> *pTVar1;
  TFad<6,_double> *pTVar2;
  long lVar3;
  
  pTVar1 = (fadexpr->fadexpr_).left_;
  pTVar2 = (fadexpr->fadexpr_).right_;
  for (lVar3 = 2; lVar3 != 8; lVar3 = lVar3 + 1) {
    *(double *)(this + lVar3 * 8) = pTVar1->dx_[lVar3 + -2] - pTVar2->dx_[lVar3 + -2];
  }
  *(double *)(this + 8) = pTVar1->val_ - pTVar2->val_;
  return (TFad<6,_double> *)this;
}

Assistant:

inline TFad<Num,T> & TFad<Num,T>::operator=(const TFadExpr<ExprT>& fadexpr) 
{
  for(int i=0; i<Num; ++i)
    dx_[i] = fadexpr.dx(i);
  
  val_ = fadexpr.val();
  
  return *this;
}